

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O3

size_t jessilib::find<char16_t,char16_t,true>
                 (basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string,
                 basic_string_view<char16_t,_std::char_traits<char16_t>_> in_substring)

{
  size_t sVar1;
  char16_t *pcVar2;
  jessilib *pjVar3;
  jessilib *pjVar4;
  char16_t *pcVar5;
  jessilib *pjVar6;
  size_t sVar7;
  jessilib *this;
  char16_t *pcVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_00;
  
  pcVar2 = in_substring._M_str;
  pjVar3 = (jessilib *)in_substring._M_len;
  in_string_00._M_len = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  if (pjVar3 == (jessilib *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = 0xffffffffffffffff;
    if (this != (jessilib *)0x0) {
      if (pjVar3 == (jessilib *)0x1) {
        in_string_00._M_str._0_2_ = *pcVar2;
        in_string_00._M_str._2_6_ = 0;
        sVar1 = find<char16_t,true>(this,in_string_00,(char32_t)in_substring._M_str);
        return sVar1;
      }
      if (pjVar3 <= this) {
        sVar7 = 0;
        pjVar4 = pjVar3;
        pcVar8 = pcVar2;
        pjVar6 = this;
        pcVar5 = in_string_00._M_len;
LAB_0028bbe6:
        do {
          uVar11 = (uint)(ushort)*in_string_00._M_len;
          lVar12 = 1;
          if (((this == (jessilib *)0x1) || ((uVar11 & 0xfc00) != 0xd800)) ||
             ((in_string_00._M_len[1] & 0xfc00U) != 0xdc00)) {
            lVar9 = 1;
          }
          else {
            uVar11 = (uint)(ushort)*in_string_00._M_len * 0x400 +
                     (uint)(ushort)in_string_00._M_len[1] + 0xfca02400;
            lVar9 = 2;
          }
          uVar10 = (uint)(ushort)*pcVar8;
          if (((pjVar4 != (jessilib *)0x1) && ((uVar10 & 0xfc00) == 0xd800)) &&
             (((ushort)pcVar8[1] & 0xfc00) == 0xdc00)) {
            uVar10 = (uint)(ushort)*pcVar8 * 0x400 + (uint)(ushort)pcVar8[1] + 0xfca02400;
            lVar12 = 2;
          }
          if (uVar11 == uVar10) {
            if (pjVar4 + -lVar12 == (jessilib *)0x0) {
              return sVar7;
            }
            in_string_00._M_len = in_string_00._M_len + lVar9;
            this = this + -lVar9;
            pjVar4 = pjVar4 + -lVar12;
            pcVar8 = pcVar8 + lVar12;
            if (this != (jessilib *)0x0) goto LAB_0028bbe6;
          }
          in_string_00._M_len = pcVar5 + lVar9;
          this = pjVar6 + -lVar9;
          sVar7 = sVar7 + lVar9;
          pjVar4 = pjVar3;
          pcVar8 = pcVar2;
          pjVar6 = this;
          pcVar5 = in_string_00._M_len;
        } while (pjVar3 <= this);
      }
    }
  }
  return sVar1;
}

Assistant:

std::pair<bool, std::string> ustring_to_mbstring(std::basic_string_view<CharT> in_string) {
	std::pair<bool, std::string> result;

	std::mbstate_t mbstate{};
	decode_result decode;
	while ((decode = decode_codepoint(in_string)).units != 0) {
		in_string.remove_prefix(decode.units);

		char buffer[MB_LEN_MAX]; // MB_LEN_MAX is constant, MB_CUR_MAX is not, and C++ doesn't have VLAs
		size_t bytes_written = std::c32rtomb(buffer, decode.codepoint, &mbstate);
		if (bytes_written > MB_LEN_MAX) {
			// Invalid codepoint; return
			result.first = false;
			return result;
		}

		result.second.append(buffer, bytes_written);
	}

	result.first = true;
	return result;
}